

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void __thiscall CUI::ClipEnable(CUI *this,CUIRect *pRect)

{
  float fVar1;
  float fVar2;
  long lVar3;
  bool bVar4;
  CUIRect *pCVar5;
  float *in_RSI;
  CUI *in_RDI;
  long in_FS_OFFSET;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  CUIRect *pOldRect;
  CUIRect Intersection;
  CUI *in_stack_ffffffffffffffd0;
  CUI *this_00;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar4 = IsClipped(in_RDI);
  if (bVar4) {
    dbg_assert_imp(&in_stack_ffffffffffffffd0->m_Enabled,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                   (char *)0x1dc0a2);
    pCVar5 = ClipArea(in_stack_ffffffffffffffd0);
    fVar6 = maximum<float>(*in_RSI,pCVar5->x);
    fVar7 = maximum<float>(in_RSI[1],pCVar5->y);
    fVar8 = minimum<float>(*in_RSI + in_RSI[2],pCVar5->x + pCVar5->w);
    fVar1 = *in_RSI;
    fVar9 = minimum<float>(in_RSI[1] + in_RSI[3],pCVar5->y + pCVar5->h);
    fVar2 = in_RSI[1];
    pCVar5 = in_RDI->m_aClips + in_RDI->m_NumClips;
    pCVar5->x = fVar6;
    pCVar5->y = fVar7;
    pCVar5->w = fVar8 - fVar1;
    pCVar5->h = fVar9 - fVar2;
  }
  else {
    pCVar5 = in_RDI->m_aClips + in_RDI->m_NumClips;
    fVar1 = in_RSI[1];
    pCVar5->x = in_RSI[0];
    pCVar5->y = fVar1;
    fVar1 = in_RSI[3];
    pCVar5->w = in_RSI[2];
    pCVar5->h = fVar1;
  }
  in_RDI->m_NumClips = in_RDI->m_NumClips + 1;
  UpdateClipping(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CUI::ClipEnable(const CUIRect *pRect)
{
	if(IsClipped())
	{
		dbg_assert(m_NumClips < MAX_CLIP_NESTING_DEPTH, "max clip nesting depth exceeded");
		const CUIRect *pOldRect = ClipArea();
		CUIRect Intersection;
		Intersection.x = maximum(pRect->x, pOldRect->x);
		Intersection.y = maximum(pRect->y, pOldRect->y);
		Intersection.w = minimum(pRect->x+pRect->w, pOldRect->x+pOldRect->w) - pRect->x;
		Intersection.h = minimum(pRect->y+pRect->h, pOldRect->y+pOldRect->h) - pRect->y;
		m_aClips[m_NumClips] = Intersection;
	}
	else
	{
		m_aClips[m_NumClips] = *pRect;
	}
	m_NumClips++;
	UpdateClipping();
}